

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClass.c
# Opt level: O0

int Fra_ClassesRefine1(Fra_Cla_t *p,int fRefineNewClass,int *pSkipped)

{
  Aig_Obj_t **Entry;
  int iVar1;
  Aig_Obj_t *pAVar2;
  Aig_Obj_t *pAVar3;
  Aig_Obj_t *local_78;
  int local_44;
  int local_40;
  int nRefis;
  int k;
  int i;
  Aig_Obj_t **ppClass;
  Aig_Obj_t *pObj;
  int *pSkipped_local;
  int fRefineNewClass_local;
  Fra_Cla_t *p_local;
  
  local_44 = 1;
  iVar1 = Vec_PtrSize(p->vClasses1);
  if (iVar1 == 0) {
    p_local._4_4_ = 0;
  }
  else {
    pAVar2 = (Aig_Obj_t *)Vec_PtrEntry(p->vClasses1,0);
    pAVar3 = Aig_ManConst1(p->pAig);
    if (pAVar2 == pAVar3) {
      __assert_fail("Vec_PtrEntry(p->vClasses1,0) != Aig_ManConst1(p->pAig)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fra/fraClass.c"
                    ,0x217,"int Fra_ClassesRefine1(Fra_Cla_t *, int, int *)");
    }
    local_40 = 0;
    Vec_PtrClear(p->vClassNew);
    for (nRefis = 0; iVar1 = Vec_PtrSize(p->vClasses1), nRefis < iVar1; nRefis = nRefis + 1) {
      pAVar2 = (Aig_Obj_t *)Vec_PtrEntry(p->vClasses1,nRefis);
      iVar1 = (*p->pFuncNodeIsConst)(pAVar2);
      if (iVar1 == 0) {
        Vec_PtrPush(p->vClassNew,pAVar2);
      }
      else {
        Vec_PtrWriteEntry(p->vClasses1,local_40,pAVar2);
        local_40 = local_40 + 1;
      }
    }
    Vec_PtrShrink(p->vClasses1,local_40);
    iVar1 = Vec_PtrSize(p->vClassNew);
    if (iVar1 == 0) {
      p_local._4_4_ = 0;
    }
    else {
      iVar1 = Vec_PtrSize(p->vClassNew);
      if (iVar1 == 1) {
        pAVar2 = (Aig_Obj_t *)Vec_PtrEntry(p->vClassNew,0);
        Fra_ClassObjSetRepr(pAVar2,(Aig_Obj_t *)0x0);
        p_local._4_4_ = 1;
      }
      else {
        Entry = p->pMemClassesFree;
        iVar1 = Vec_PtrSize(p->vClassNew);
        p->pMemClassesFree = p->pMemClassesFree + (iVar1 << 1);
        for (nRefis = 0; iVar1 = Vec_PtrSize(p->vClassNew), nRefis < iVar1; nRefis = nRefis + 1) {
          pAVar2 = (Aig_Obj_t *)Vec_PtrEntry(p->vClassNew,nRefis);
          Entry[nRefis] = pAVar2;
          iVar1 = Vec_PtrSize(p->vClassNew);
          Entry[iVar1 + nRefis] = (Aig_Obj_t *)0x0;
          if (nRefis == 0) {
            local_78 = (Aig_Obj_t *)0x0;
          }
          else {
            local_78 = *Entry;
          }
          Fra_ClassObjSetRepr(pAVar2,local_78);
        }
        if (*Entry == (Aig_Obj_t *)0x0) {
          __assert_fail("ppClass[0] != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fra/fraClass.c"
                        ,0x239,"int Fra_ClassesRefine1(Fra_Cla_t *, int, int *)");
        }
        Vec_PtrPush(p->vClasses,Entry);
        if (fRefineNewClass == 0) {
          if (pSkipped != (int *)0x0) {
            *pSkipped = *pSkipped + 1;
          }
        }
        else {
          local_44 = Fra_RefineClassLastIter(p,p->vClasses);
          local_44 = local_44 + 1;
        }
        p_local._4_4_ = local_44;
      }
    }
  }
  return p_local._4_4_;
}

Assistant:

int Fra_ClassesRefine1( Fra_Cla_t * p, int fRefineNewClass, int * pSkipped )
{
    Aig_Obj_t * pObj, ** ppClass;
    int i, k, nRefis = 1;
    // check if there is anything to refine
    if ( Vec_PtrSize(p->vClasses1) == 0 )
        return 0;
    // make sure constant 1 class contains only non-constant nodes
    assert( Vec_PtrEntry(p->vClasses1,0) != Aig_ManConst1(p->pAig) );
    // collect all the nodes to be refined
    k = 0;
    Vec_PtrClear( p->vClassNew );
    Vec_PtrForEachEntry( Aig_Obj_t *, p->vClasses1, pObj, i )
    {
        if ( p->pFuncNodeIsConst( pObj ) )
            Vec_PtrWriteEntry( p->vClasses1, k++, pObj );
        else 
            Vec_PtrPush( p->vClassNew, pObj );
    }
    Vec_PtrShrink( p->vClasses1, k );
    if ( Vec_PtrSize(p->vClassNew) == 0 )
        return 0;
/*
    printf( "Refined const-1 class: {" );
    Vec_PtrForEachEntry( Aig_Obj_t *, p->vClassNew, pObj, i )
        printf( " %d", pObj->Id );
    printf( " }\n" );
*/
    if ( Vec_PtrSize(p->vClassNew) == 1 )
    {
        Fra_ClassObjSetRepr( (Aig_Obj_t *)Vec_PtrEntry(p->vClassNew,0), NULL );
        return 1;
    }
    // create a new class composed of these nodes
    ppClass = p->pMemClassesFree;
    p->pMemClassesFree += 2 * Vec_PtrSize(p->vClassNew);
    Vec_PtrForEachEntry( Aig_Obj_t *, p->vClassNew, pObj, i )
    {
        ppClass[i] = pObj;
        ppClass[Vec_PtrSize(p->vClassNew)+i] = NULL;
        Fra_ClassObjSetRepr( pObj, i? ppClass[0] : NULL );
    }
    assert( ppClass[0] != NULL );
    Vec_PtrPush( p->vClasses, ppClass );
    // iteratively refine this class
    if ( fRefineNewClass )
        nRefis += Fra_RefineClassLastIter( p, p->vClasses );
    else if ( pSkipped )
        (*pSkipped)++;
    return nRefis;
}